

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O3

target_ulong helper_read_crN_x86_64(CPUX86State *env,int reg)

{
  target_ulong tVar1;
  uintptr_t unaff_retaddr;
  
  cpu_svm_check_intercept_param_x86_64(env,reg,0,unaff_retaddr);
  if (reg == 8) {
    if ((env->hflags2 & 8) == 0) {
      tVar1 = 0;
    }
    else {
      tVar1 = (target_ulong)env->v_tpr;
    }
  }
  else {
    tVar1 = env->cr[reg];
  }
  return tVar1;
}

Assistant:

target_ulong helper_read_crN(CPUX86State *env, int reg)
{
    target_ulong val;

    cpu_svm_check_intercept_param(env, SVM_EXIT_READ_CR0 + reg, 0, GETPC());
    switch (reg) {
    default:
        val = env->cr[reg];
        break;
    case 8:
        if (!(env->hflags2 & HF2_VINTR_MASK)) {
            // val = cpu_get_apic_tpr(env_archcpu(env)->apic_state);
            val = 0;
        } else {
            val = env->v_tpr;
        }
        break;
    }
    return val;
}